

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

int read_features_json<true>(vw *all,v_array<example_*> *examples)

{
  size_type sVar1;
  size_t sVar2;
  vw *in_RSI;
  example **in_RDI;
  substring example;
  char empty;
  example *ae;
  DecisionServiceInteraction interaction;
  size_t num_chars_initial;
  size_t num_chars;
  char *line;
  bool reread;
  void *in_stack_00000190;
  example_factory_t in_stack_00000198;
  char *in_stack_000001a0;
  v_array<example_*> *in_stack_000001a8;
  vw *in_stack_000001b0;
  example_factory_t in_stack_000003f8;
  undefined1 in_stack_00000407;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  v_array<example_*> *in_stack_00000418;
  vw *in_stack_00000420;
  void *in_stack_00000430;
  DecisionServiceInteraction *in_stack_00000438;
  example **in_stack_fffffffffffffef8;
  vw *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  vw *pvVar3;
  vw *in_stack_ffffffffffffff20;
  undefined1 local_90 [84];
  bool local_3c;
  size_t local_38;
  long local_30;
  char *local_28;
  undefined1 local_19;
  undefined8 local_18;
  example **local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    local_19 = 0;
    local_38 = read_features((vw *)in_stack_ffffffffffffff08,(char **)in_stack_ffffffffffffff00,
                             (size_t *)in_stack_fffffffffffffef8);
    if (local_38 == 0) {
      return 0;
    }
    local_28[local_30] = '\0';
    if (((local_10[1]->super_example_predict).feature_space[8].values.erase_count & 0x100) == 0) {
      VW::read_line_json<true>
                (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                 in_stack_00000190);
    }
    else if (*local_28 == '{') {
      pvVar3 = (vw *)local_90;
      DecisionServiceInteraction::DecisionServiceInteraction
                ((DecisionServiceInteraction *)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff00 = pvVar3;
      in_stack_fffffffffffffef8 = local_10;
      pvVar3 = in_stack_ffffffffffffff00;
      VW::read_line_decision_service_json<true>
                (in_stack_00000420,in_stack_00000418,in_stack_00000410,in_stack_00000408,
                 (bool)in_stack_00000407,in_stack_000003f8,in_stack_00000430,in_stack_00000438);
      if ((local_3c & 1U) != 0) {
        VW::return_multiple_example(in_stack_ffffffffffffff20,(v_array<example_*> *)pvVar3);
        in_stack_ffffffffffffff08 = local_18;
        VW::get_unused_example(in_stack_ffffffffffffff00);
        v_array<example_*>::push_back
                  ((v_array<example_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_19 = 1;
      }
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_90 + 0x20));
      if (sVar1 == 0) {
        local_19 = 1;
      }
      DecisionServiceInteraction::~DecisionServiceInteraction
                ((DecisionServiceInteraction *)in_stack_ffffffffffffff00);
    }
    else {
      local_19 = 1;
    }
  } while ((local_19 & 1) != 0);
  sVar2 = v_array<example_*>::size((v_array<example_*> *)local_18);
  if (1 < sVar2) {
    VW::get_unused_example(in_stack_ffffffffffffff00);
    substring_to_example
              ((vw *)interaction.actions.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
               (example *)
               interaction.actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,(substring)interaction._48_16_);
    v_array<example_*>::push_back
              ((v_array<example_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  return 1;
}

Assistant:

int read_features_json(vw* all, v_array<example*>& examples)
{
  bool reread;
  do
  {
    reread = false;

    char* line;
    size_t num_chars;
    size_t num_chars_initial = read_features(all, line, num_chars);
    if (num_chars_initial < 1)
      return (int)num_chars_initial;

    line[num_chars] = '\0';
    if (all->p->decision_service_json)
    {
      // Skip lines that do not start with "{"
      if (line[0] != '{')
      {
        reread = true;
        continue;
      }

      DecisionServiceInteraction interaction;
      VW::template read_line_decision_service_json<audit>(*all, examples, line, num_chars, false,
          reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all, &interaction);

      if (interaction.skipLearn)
      {
        VW::return_multiple_example(*all, examples);
        examples.push_back(&VW::get_unused_example(all));
        reread = true;
      }

      // let's continue reading data until we find a line with actions provided
      if (interaction.actions.size() == 0)
        reread = true;
    }
    else
      VW::template read_line_json<audit>(
          *all, examples, line, reinterpret_cast<VW::example_factory_t>(&VW::get_unused_example), all);
  } while (reread);

  // note: the json parser does single pass parsing and cannot determine if a shared example is needed.
  // since the communication between the parsing thread the main learner expects examples to be requested in order (as
  // they're layed out in memory) there is no way to determine upfront if a shared example exists thus even if there are
  // no features for the shared example, still an empty example is returned.

  if (examples.size() > 1)
  {  // insert new line example at the end
    example& ae = VW::get_unused_example(all);
    char empty = '\0';
    substring example = {&empty, &empty};
    substring_to_example(all, &ae, example);

    examples.push_back(&ae);
  }

  return 1;
}